

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O1

int ARKBandPrecSolve(sunrealtype t,N_Vector y,N_Vector fy,N_Vector r,N_Vector z,sunrealtype gamma,
                    sunrealtype delta,int lr,void *bp_data)

{
  int iVar1;
  
  iVar1 = SUNLinSolSolve(0,*(undefined8 *)((long)bp_data + 0x28),
                         *(undefined8 *)((long)bp_data + 0x20),z,r);
  return iVar1;
}

Assistant:

static int ARKBandPrecSolve(SUNDIALS_MAYBE_UNUSED sunrealtype t,
                            SUNDIALS_MAYBE_UNUSED N_Vector y,
                            SUNDIALS_MAYBE_UNUSED N_Vector fy, N_Vector r,
                            N_Vector z, SUNDIALS_MAYBE_UNUSED sunrealtype gamma,
                            SUNDIALS_MAYBE_UNUSED sunrealtype delta,
                            SUNDIALS_MAYBE_UNUSED int lr, void* bp_data)
{
  ARKBandPrecData pdata;
  int retval;

  /* Assume matrix and linear solver have already been allocated. */
  pdata = (ARKBandPrecData)bp_data;

  /* Call banded solver object to do the work */
  retval = SUNLinSolSolve(pdata->LS, pdata->savedP, z, r, ZERO);
  return (retval);
}